

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void miSubtractNonO1(QRegionPrivate *dest,QRect *r,QRect *rEnd,int y1,int y2)

{
  QRect *this;
  qsizetype qVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  QRect *pNextRect;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int *in_stack_ffffffffffffffc8;
  long local_10;
  
  QList<QRect>::data((QList<QRect> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_10 = in_RSI; local_10 != in_RDX; local_10 = local_10 + 0x10) {
    this = (QRect *)(long)*in_RDI;
    qVar1 = QList<QRect>::size((QList<QRect> *)(in_RDI + 2));
    if (qVar1 + -1 <= (long)this) {
      in_stack_ffffffffffffffc8 = in_RDI + 2;
      QList<QRect>::size((QList<QRect> *)(in_RDI + 2));
      QList<QRect>::resize((QList<QRect> *)this,(qsizetype)in_stack_ffffffffffffffc8);
      QList<QRect>::data((QList<QRect> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    in_stack_ffffffffffffffc0 = QRect::left((QRect *)0x65aa8e);
    in_stack_ffffffffffffffc4 = in_ECX;
    QRect::right((QRect *)0x65aaa4);
    QRect::setCoords(this,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                     in_stack_ffffffffffffffc0);
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

static void miSubtractNonO1(QRegionPrivate &dest, const QRect *r,
                            const QRect *rEnd, int y1, int y2)
{
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    Q_ASSERT(y1<=y2);

    while (r != rEnd) {
        Q_ASSERT(r->left() <= r->right());
        MEMCHECK(dest, pNextRect, dest.rects)
        pNextRect->setCoords(r->left(), y1, r->right(), y2);
        ++dest.numRects;
        ++pNextRect;
        ++r;
    }
}